

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void UA_NodeStore_delete(UA_NodeStore *ns)

{
  uint uVar1;
  UA_NodeStoreEntry *__ptr;
  ulong uVar2;
  UA_NodeStoreEntry **__ptr_00;
  
  uVar1 = ns->size;
  __ptr_00 = ns->entries;
  if ((ulong)uVar1 != 0) {
    uVar2 = 0;
    do {
      __ptr = __ptr_00[uVar2];
      if ((UA_NodeStoreEntry *)0x1 < __ptr) {
        UA_Node_deleteMembersAnyNodeClass(&__ptr->node);
        free(__ptr);
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    __ptr_00 = ns->entries;
  }
  free(__ptr_00);
  free(ns);
  return;
}

Assistant:

void
UA_NodeStore_delete(UA_NodeStore *ns) {
    UA_UInt32 size = ns->size;
    UA_NodeStoreEntry **entries = ns->entries;
    for(UA_UInt32 i = 0; i < size; ++i) {
        if(entries[i] > UA_NODESTORE_TOMBSTONE)
            deleteEntry(entries[i]);
    }
    UA_free(ns->entries);
    UA_free(ns);
}